

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Allocator *pAVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  Option *pOVar38;
  Mat *this_00;
  int iVar39;
  int iVar40;
  uint uVar41;
  float *pfVar42;
  void *pvVar43;
  long lVar44;
  int elempack;
  long lVar45;
  Mat *pMVar46;
  undefined1 (*pauVar47) [16];
  Mat *b;
  Mat *a;
  ulong uVar48;
  int y;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 (*pauVar52) [16];
  int iVar53;
  undefined1 (*pauVar54) [16];
  long lVar55;
  float *pfVar56;
  float *pfVar57;
  void *pvVar58;
  float fVar59;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  __m128 afVar108;
  binary_op_pow op;
  __m128 _p1;
  __m128 _a0;
  binary_op_pow local_b9;
  Mat *local_b8;
  undefined8 local_b0;
  ulong local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  float *local_88;
  int local_7c;
  Mat *local_78;
  Mat *local_70;
  ulong local_68;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  size_t local_38;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar34 = a->elempack;
  iVar35 = a[1].elempack;
  if ((iVar35 != 4 && iVar34 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar34 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar34;
  }
  b = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b8 = this_00;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 0:
    if (a->dims - 1U < 4) {
      local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar34);
      local_98._0_8_ = opt;
      uVar41 = a->w;
      uVar50 = a->h;
      iVar39 = a->d;
      uVar49 = a->c;
      uVar36 = (ulong)uVar49;
      local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar50 * uVar41 * iVar39);
      local_88 = (float *)a->elemsize;
      uVar51 = a[1].w;
      uVar4 = a[1].h;
      iVar40 = a[1].d;
      uVar3 = a[1].c;
      uVar37 = (ulong)uVar3;
      iVar53 = uVar4 * uVar51 * iVar40;
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar41 == 1) {
          Mat::create_like(this_00,b,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar41 = iVar53 * iVar35;
              uVar36 = 0;
              do {
                pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                fVar59 = *a->data;
                if ((int)uVar41 < 4) {
                  uVar50 = 0;
                }
                else {
                  iVar34 = 3;
                  do {
                    auVar106._0_4_ = *pfVar42 + fVar59;
                    auVar106._4_4_ = pfVar42[1] + fVar59;
                    auVar106._8_4_ = pfVar42[2] + fVar59;
                    auVar106._12_4_ = pfVar42[3] + fVar59;
                    *pauVar54 = auVar106;
                    pfVar42 = pfVar42 + 4;
                    pauVar54 = pauVar54 + 1;
                    iVar34 = iVar34 + 4;
                    uVar50 = uVar41 & 0xfffffffc;
                  } while (iVar34 < (int)uVar41);
                }
                if (uVar41 - uVar50 != 0 && (int)uVar50 <= (int)uVar41) {
                  lVar44 = 0;
                  do {
                    *(float *)((long)*pauVar54 + lVar44 * 4) = pfVar42[lVar44] + fVar59;
                    lVar44 = lVar44 + 1;
                  } while (uVar41 - uVar50 != (int)lVar44);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar41,(size_t)local_88,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          if (iVar35 == 1 && a[1].w == 1) goto LAB_003a7bce;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>(a,b,this_00,pOVar38);
          break;
        case 2:
          Mat::create(this_00,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
          pauVar54 = (undefined1 (*) [16])this_00->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pfVar42 = (float *)a->data;
              pfVar56 = (float *)a[1].data;
              uVar41 = 0;
              do {
                if (0 < (int)uVar51) {
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  uVar50 = uVar51;
                  do {
                    auVar85._0_4_ = *pfVar56 + fVar59;
                    auVar85._4_4_ = pfVar56[1] + fVar1;
                    auVar85._8_4_ = pfVar56[2] + fVar32;
                    auVar85._12_4_ = pfVar56[3] + fVar33;
                    *pauVar54 = auVar85;
                    pfVar56 = pfVar56 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pfVar42 = pfVar42 + 4;
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)a->data + uVar36 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36);
                    auVar83._0_4_ = *pfVar42 + fVar59;
                    auVar83._4_4_ = pfVar42[1] + fVar1;
                    auVar83._8_4_ = pfVar42[2] + fVar32;
                    auVar83._12_4_ = pfVar42[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar83;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)a->data + uVar36 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36);
                    auVar84._0_4_ = *pfVar42 + fVar59;
                    auVar84._4_4_ = pfVar42[1] + fVar1;
                    auVar84._8_4_ = pfVar42[2] + fVar32;
                    auVar84._12_4_ = pfVar42[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar84;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      fVar59 = *pfVar56;
                      fVar1 = pfVar56[1];
                      fVar32 = pfVar56[2];
                      fVar33 = pfVar56[3];
                      uVar50 = uVar51;
                      do {
                        auVar72._0_4_ = *pfVar42 + fVar59;
                        auVar72._4_4_ = pfVar42[1] + fVar1;
                        auVar72._8_4_ = pfVar42[2] + fVar32;
                        auVar72._12_4_ = pfVar42[3] + fVar33;
                        *pauVar54 = auVar72;
                        pfVar42 = pfVar42 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pfVar56 = pfVar56 + 4;
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar4);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      fVar59 = *pfVar56;
                      fVar1 = pfVar56[1];
                      fVar32 = pfVar56[2];
                      fVar33 = pfVar56[3];
                      uVar41 = 0;
                      do {
                        uVar50 = uVar51;
                        if (0 < (int)uVar51) {
                          do {
                            auVar65._0_4_ = *pfVar42 + fVar59;
                            auVar65._4_4_ = pfVar42[1] + fVar1;
                            auVar65._8_4_ = pfVar42[2] + fVar32;
                            auVar65._12_4_ = pfVar42[3] + fVar33;
                            *pauVar54 = auVar65;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    pfVar56 = pfVar56 + 4;
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar41,uVar50,(size_t)local_88,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar41,uVar50,(size_t)local_88,(uint)local_b0,
                      *(Allocator **)(local_98._0_8_ + 8));
          pauVar54 = (undefined1 (*) [16])local_b8->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)local_b8->c * local_b8->cstep == 0) {
            return -100;
          }
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar50) {
              pfVar42 = (float *)a->data;
              pfVar56 = (float *)a[1].data;
              uVar49 = 0;
              do {
                if (0 < (int)uVar41) {
                  fVar59 = *pfVar56;
                  fVar1 = pfVar56[1];
                  fVar32 = pfVar56[2];
                  fVar33 = pfVar56[3];
                  uVar51 = uVar41;
                  do {
                    auVar103._0_4_ = *pfVar42 + fVar59;
                    auVar103._4_4_ = pfVar42[1] + fVar1;
                    auVar103._8_4_ = pfVar42[2] + fVar32;
                    auVar103._12_4_ = pfVar42[3] + fVar33;
                    *pauVar54 = auVar103;
                    pfVar42 = pfVar42 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar51 = uVar51 - 1;
                  } while (uVar51 != 0);
                }
                pfVar56 = pfVar56 + 4;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar50);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          this_00 = local_b8;
LAB_003a7bce:
          iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_add>
                             (a,b,this_00,pOVar38);
          return iVar34;
        }
        if (a[1].dims != 2) {
          return 0;
        }
        pOVar38 = *(Option **)(local_98._0_8_ + 8);
LAB_003a3d63:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>
                           (a,b,this_00,pOVar38);
        return iVar34;
      case 3:
        if (a[1].dims == 3) {
          local_a8 = uVar37;
          if (uVar3 == uVar49 && ((uVar51 ^ 1) == 0 && (uVar4 ^ 1) == 0)) {
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)local_a0) {
                    sVar5 = this_00->cstep;
                    sVar7 = this_00->elemsize;
                    pfVar42 = (float *)((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
                    fVar59 = *pfVar42;
                    fVar1 = pfVar42[1];
                    fVar32 = pfVar42[2];
                    fVar33 = pfVar42[3];
                    pvVar10 = this_00->data;
                    sVar8 = a->cstep;
                    sVar9 = a->elemsize;
                    pvVar43 = a->data;
                    lVar44 = 0;
                    iVar34 = (int)local_a0;
                    do {
                      pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37);
                      auVar70._0_4_ = *pfVar42 + fVar59;
                      auVar70._4_4_ = pfVar42[1] + fVar1;
                      auVar70._8_4_ = pfVar42[2] + fVar32;
                      auVar70._12_4_ = pfVar42[3] + fVar33;
                      *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                           auVar70;
                      lVar44 = lVar44 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar51 == uVar41) {
            if (iVar35 == 1 && (uVar3 == 1 && uVar4 == uVar50)) {
              Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar49) {
                  uVar37 = 0;
                  do {
                    if (0 < (int)local_a0) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      sVar8 = a->cstep;
                      pvVar10 = this_00->data;
                      pvVar43 = a[1].data;
                      sVar9 = a->elemsize;
                      pvVar58 = a->data;
                      lVar44 = 0;
                      iVar34 = (int)local_a0;
                      do {
                        pfVar42 = (float *)((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37);
                        fVar59 = *(float *)((long)pvVar43 + lVar44);
                        auVar77._0_4_ = fVar59 + *pfVar42;
                        auVar77._4_4_ = fVar59 + pfVar42[1];
                        auVar77._8_4_ = fVar59 + pfVar42[2];
                        auVar77._12_4_ = fVar59 + pfVar42[3];
                        *(undefined1 (*) [16])((long)pvVar10 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar77;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar36);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) {
LAB_003a8024:
              local_7c = iVar35;
              Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = a[1].cstep;
                      sVar7 = a[1].elemsize;
                      pfVar42 = (float *)((long)a->data + a->cstep * uVar37 * a->elemsize);
                      fVar59 = *pfVar42;
                      fVar1 = pfVar42[1];
                      fVar32 = pfVar42[2];
                      fVar33 = pfVar42[3];
                      pvVar10 = a[1].data;
                      sVar8 = this_00->cstep;
                      sVar9 = this_00->elemsize;
                      pvVar43 = this_00->data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                        auVar91._0_4_ = *pfVar42 + fVar59;
                        auVar91._4_4_ = pfVar42[1] + fVar1;
                        auVar91._8_4_ = pfVar42[2] + fVar32;
                        auVar91._12_4_ = pfVar42[3] + fVar33;
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                             auVar91;
                        lVar44 = lVar44 + 0x10;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((iVar34 == 1) && (uVar4 == uVar50)) && (uVar49 == 1)) {
              local_7c = iVar35;
              Mat::create(this_00,uVar41,uVar50,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      pvVar10 = a->data;
                      pvVar43 = this_00->data;
                      sVar8 = a[1].cstep;
                      sVar9 = a[1].elemsize;
                      pvVar58 = a[1].data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        fVar59 = *(float *)((long)pvVar10 + lVar44);
                        pfVar42 = (float *)((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37);
                        auVar99._0_4_ = *pfVar42 + fVar59;
                        auVar99._4_4_ = pfVar42[1] + fVar59;
                        auVar99._8_4_ = pfVar42[2] + fVar59;
                        auVar99._12_4_ = pfVar42[3] + fVar59;
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar99;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) goto LAB_003a8024;
          if ((((uVar51 ^ 1) == 0 && uVar4 == uVar50) && uVar49 == uVar3) && uVar41 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].cstep;
                    sVar7 = a[1].elemsize;
                    pvVar10 = a[1].data;
                    pauVar54 = (undefined1 (*) [16])
                               (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                    pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        pfVar56 = (float *)((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar49 = uVar41;
                        do {
                          auVar87._0_4_ = *pfVar42 + fVar59;
                          auVar87._4_4_ = pfVar42[1] + fVar1;
                          auVar87._8_4_ = pfVar42[2] + fVar32;
                          auVar87._12_4_ = pfVar42[3] + fVar33;
                          *pauVar54 = auVar87;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar51 == uVar41 && (uVar4 ^ 1) == 0) && uVar49 == uVar3) && uVar50 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].elemsize;
                    pvVar43 = (void *)(this_00->cstep * uVar37 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar58 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    sVar7 = a[1].cstep;
                    pvVar10 = a[1].data;
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          pfVar42 = (float *)((long)pvVar58 + lVar44);
                          pfVar56 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                          auVar93._0_4_ = *pfVar56 + *pfVar42;
                          auVar93._4_4_ = pfVar56[1] + pfVar42[1];
                          auVar93._8_4_ = pfVar56[2] + pfVar42[2];
                          auVar93._12_4_ = pfVar56[3] + pfVar42[3];
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar93;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar4 == uVar50) && (uVar51 != 1 && uVar41 == 1)) {
            local_7c = iVar35;
            local_78 = b;
            local_70 = a;
            Mat::create(this_00,uVar51,uVar50,uVar49,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = local_70->cstep;
                    sVar7 = local_70->elemsize;
                    pvVar10 = local_70->data;
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * uVar37 * local_b8->elemsize + (long)local_b8->data
                               );
                    pfVar42 = (float *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                       (long)local_70[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        pfVar56 = (float *)((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar41 = uVar51;
                        do {
                          auVar101._0_4_ = *pfVar42 + fVar59;
                          auVar101._4_4_ = pfVar42[1] + fVar1;
                          auVar101._8_4_ = pfVar42[2] + fVar32;
                          auVar101._12_4_ = pfVar42[3] + fVar33;
                          *pauVar54 = auVar101;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          local_7c = iVar35;
          local_78 = b;
          local_70 = a;
          if ((uVar50 == 1 && uVar3 == uVar49) && (uVar4 != 1 && uVar51 == uVar41)) {
            Mat::create(this_00,uVar41,uVar4,uVar49,sVar5,iVar35,(Allocator *)pOVar38);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar4) {
                    sVar5 = local_70->elemsize;
                    pvVar43 = (void *)(local_b8->cstep * uVar37 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar58 = (void *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                      (long)local_70[1].data);
                    sVar7 = local_70->cstep;
                    pvVar10 = local_70->data;
                    uVar50 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                          pfVar56 = (float *)((long)pvVar58 + lVar44);
                          auVar105._0_4_ = *pfVar56 + *pfVar42;
                          auVar105._4_4_ = pfVar56[1] + pfVar42[1];
                          auVar105._8_4_ = pfVar56[2] + pfVar42[2];
                          auVar105._12_4_ = pfVar56[3] + pfVar42[3];
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar105;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar4);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003a3d63;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)(a->cstep * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar41 = 0;
                      do {
                        if (0 < (int)uVar51) {
                          fVar59 = *pfVar56;
                          fVar1 = pfVar56[1];
                          fVar32 = pfVar56[2];
                          fVar33 = pfVar56[3];
                          uVar50 = uVar51;
                          do {
                            auVar63._0_4_ = *pfVar42 + fVar59;
                            auVar63._4_4_ = pfVar42[1] + fVar1;
                            auVar63._8_4_ = pfVar42[2] + fVar32;
                            auVar63._12_4_ = pfVar42[3] + fVar33;
                            *pauVar54 = auVar63;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        pfVar56 = pfVar56 + 4;
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar49) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)local_78->data + uVar37 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a->cstep;
                  sVar9 = a->elemsize;
                  pvVar43 = a->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37);
                    auVar97._0_4_ = *pfVar42 + fVar59;
                    auVar97._4_4_ = pfVar42[1] + fVar1;
                    auVar97._8_4_ = pfVar42[2] + fVar32;
                    auVar97._12_4_ = pfVar42[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                         auVar97;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar36);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7bce;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar49) {
            uVar37 = 0;
            do {
              if (0 < (int)uVar50) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar41) {
                    fVar59 = *pfVar56;
                    fVar1 = pfVar56[1];
                    fVar32 = pfVar56[2];
                    fVar33 = pfVar56[3];
                    uVar51 = uVar41;
                    do {
                      auVar74._0_4_ = *pfVar42 + fVar59;
                      auVar74._4_4_ = pfVar42[1] + fVar1;
                      auVar74._8_4_ = pfVar42[2] + fVar32;
                      auVar74._12_4_ = pfVar42[3] + fVar33;
                      *pauVar54 = auVar74;
                      pfVar42 = pfVar42 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar51 = uVar51 - 1;
                    } while (uVar51 != 0);
                  }
                  pfVar56 = pfVar56 + 4;
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar50);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar36);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        pOVar38 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003a3d63;
        local_b0 = (float *)uVar36;
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,iVar39,uVar49,(size_t)local_88,iVar34,(Allocator *)pOVar38
                   );
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = a[1].dims;
        if (iVar34 == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)(uint)local_b0) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  pfVar42 = (float *)((long)local_78->data + uVar37 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = a->data;
                  sVar8 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar43 = this_00->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                    auVar95._0_4_ = *pfVar42 + fVar59;
                    auVar95._4_4_ = pfVar42[1] + fVar1;
                    auVar95._8_4_ = pfVar42[2] + fVar32;
                    auVar95._12_4_ = pfVar42[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                         auVar95;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while ((float *)uVar37 != local_b0);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7bce;
        }
        if (iVar34 == 3) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar51 = uVar41;
                        do {
                          auVar89._0_4_ = *pfVar42 + fVar59;
                          auVar89._4_4_ = pfVar42[1] + fVar1;
                          auVar89._8_4_ = pfVar42[2] + fVar32;
                          auVar89._12_4_ = pfVar42[3] + fVar33;
                          *pauVar54 = auVar89;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      pfVar56 = pfVar56 + 4;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 2) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    fVar59 = *pfVar56;
                    fVar1 = pfVar56[1];
                    fVar32 = pfVar56[2];
                    fVar33 = pfVar56[3];
                    uVar49 = 0;
                    do {
                      uVar51 = uVar41;
                      if (0 < (int)uVar41) {
                        do {
                          auVar67._0_4_ = *pfVar42 + fVar59;
                          auVar67._4_4_ = pfVar42[1] + fVar1;
                          auVar67._8_4_ = pfVar42[2] + fVar32;
                          auVar67._12_4_ = pfVar42[3] + fVar33;
                          *pauVar54 = auVar67;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  pfVar56 = pfVar56 + 4;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 1:
    pMVar46 = b;
    goto LAB_003a3441;
  case 2:
    if (a->dims - 1U < 4) {
      local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar34);
      local_98._0_8_ = opt;
      uVar41 = a->w;
      uVar50 = a->h;
      iVar39 = a->d;
      uVar49 = a->c;
      uVar36 = (ulong)uVar49;
      local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar50 * uVar41 * iVar39);
      local_88 = (float *)a->elemsize;
      uVar51 = a[1].w;
      uVar4 = a[1].h;
      iVar40 = a[1].d;
      uVar3 = a[1].c;
      uVar37 = (ulong)uVar3;
      iVar53 = uVar4 * uVar51 * iVar40;
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar41 == 1) {
          Mat::create_like(this_00,b,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar41 = iVar53 * iVar35;
              uVar36 = 0;
              do {
                pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                fVar59 = *a->data;
                if ((int)uVar41 < 4) {
                  uVar50 = 0;
                }
                else {
                  iVar34 = 3;
                  do {
                    auVar107._0_4_ = *pfVar42 * fVar59;
                    auVar107._4_4_ = pfVar42[1] * fVar59;
                    auVar107._8_4_ = pfVar42[2] * fVar59;
                    auVar107._12_4_ = pfVar42[3] * fVar59;
                    *pauVar54 = auVar107;
                    pfVar42 = pfVar42 + 4;
                    pauVar54 = pauVar54 + 1;
                    iVar34 = iVar34 + 4;
                    uVar50 = uVar41 & 0xfffffffc;
                  } while (iVar34 < (int)uVar41);
                }
                if (uVar41 - uVar50 != 0 && (int)uVar50 <= (int)uVar41) {
                  lVar44 = 0;
                  do {
                    *(float *)((long)*pauVar54 + lVar44 * 4) = pfVar42[lVar44] * fVar59;
                    lVar44 = lVar44 + 1;
                  } while (uVar41 - uVar50 != (int)lVar44);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar41,(size_t)local_88,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          if (iVar35 == 1 && a[1].w == 1) goto LAB_003a7b96;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>(a,b,this_00,pOVar38);
          break;
        case 2:
          Mat::create(this_00,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
          pauVar54 = (undefined1 (*) [16])this_00->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pfVar42 = (float *)a->data;
              pfVar56 = (float *)a[1].data;
              uVar41 = 0;
              do {
                if (0 < (int)uVar51) {
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  uVar50 = uVar51;
                  do {
                    auVar82._0_4_ = *pfVar56 * fVar59;
                    auVar82._4_4_ = pfVar56[1] * fVar1;
                    auVar82._8_4_ = pfVar56[2] * fVar32;
                    auVar82._12_4_ = pfVar56[3] * fVar33;
                    *pauVar54 = auVar82;
                    pfVar56 = pfVar56 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pfVar42 = pfVar42 + 4;
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)a->data + uVar36 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36);
                    auVar80._0_4_ = *pfVar42 * fVar59;
                    auVar80._4_4_ = pfVar42[1] * fVar1;
                    auVar80._8_4_ = pfVar42[2] * fVar32;
                    auVar80._12_4_ = pfVar42[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar80;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)a->data + uVar36 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36);
                    auVar81._0_4_ = *pfVar42 * fVar59;
                    auVar81._4_4_ = pfVar42[1] * fVar1;
                    auVar81._8_4_ = pfVar42[2] * fVar32;
                    auVar81._12_4_ = pfVar42[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar81;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      fVar59 = *pfVar56;
                      fVar1 = pfVar56[1];
                      fVar32 = pfVar56[2];
                      fVar33 = pfVar56[3];
                      uVar50 = uVar51;
                      do {
                        auVar71._0_4_ = *pfVar42 * fVar59;
                        auVar71._4_4_ = pfVar42[1] * fVar1;
                        auVar71._8_4_ = pfVar42[2] * fVar32;
                        auVar71._12_4_ = pfVar42[3] * fVar33;
                        *pauVar54 = auVar71;
                        pfVar42 = pfVar42 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pfVar56 = pfVar56 + 4;
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar4);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      fVar59 = *pfVar56;
                      fVar1 = pfVar56[1];
                      fVar32 = pfVar56[2];
                      fVar33 = pfVar56[3];
                      uVar41 = 0;
                      do {
                        uVar50 = uVar51;
                        if (0 < (int)uVar51) {
                          do {
                            auVar64._0_4_ = *pfVar42 * fVar59;
                            auVar64._4_4_ = pfVar42[1] * fVar1;
                            auVar64._8_4_ = pfVar42[2] * fVar32;
                            auVar64._12_4_ = pfVar42[3] * fVar33;
                            *pauVar54 = auVar64;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    pfVar56 = pfVar56 + 4;
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar41,uVar50,(size_t)local_88,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar41,uVar50,(size_t)local_88,(uint)local_b0,
                      *(Allocator **)(local_98._0_8_ + 8));
          pauVar54 = (undefined1 (*) [16])local_b8->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)local_b8->c * local_b8->cstep == 0) {
            return -100;
          }
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar50) {
              pfVar42 = (float *)a->data;
              pfVar56 = (float *)a[1].data;
              uVar49 = 0;
              do {
                if (0 < (int)uVar41) {
                  fVar59 = *pfVar56;
                  fVar1 = pfVar56[1];
                  fVar32 = pfVar56[2];
                  fVar33 = pfVar56[3];
                  uVar51 = uVar41;
                  do {
                    auVar102._0_4_ = *pfVar42 * fVar59;
                    auVar102._4_4_ = pfVar42[1] * fVar1;
                    auVar102._8_4_ = pfVar42[2] * fVar32;
                    auVar102._12_4_ = pfVar42[3] * fVar33;
                    *pauVar54 = auVar102;
                    pfVar42 = pfVar42 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar51 = uVar51 - 1;
                  } while (uVar51 != 0);
                }
                pfVar56 = pfVar56 + 4;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar50);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          this_00 = local_b8;
LAB_003a7b96:
          iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_mul>
                             (a,b,this_00,pOVar38);
          return iVar34;
        }
        if (a[1].dims != 2) {
          return 0;
        }
        pOVar38 = *(Option **)(local_98._0_8_ + 8);
LAB_003a3b2e:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>
                           (a,b,this_00,pOVar38);
        return iVar34;
      case 3:
        if (a[1].dims == 3) {
          local_a8 = uVar37;
          if (uVar3 == uVar49 && ((uVar51 ^ 1) == 0 && (uVar4 ^ 1) == 0)) {
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)local_a0) {
                    sVar5 = this_00->cstep;
                    sVar7 = this_00->elemsize;
                    pfVar42 = (float *)((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
                    fVar59 = *pfVar42;
                    fVar1 = pfVar42[1];
                    fVar32 = pfVar42[2];
                    fVar33 = pfVar42[3];
                    pvVar10 = this_00->data;
                    sVar8 = a->cstep;
                    sVar9 = a->elemsize;
                    pvVar43 = a->data;
                    lVar44 = 0;
                    iVar34 = (int)local_a0;
                    do {
                      pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37);
                      auVar69._0_4_ = *pfVar42 * fVar59;
                      auVar69._4_4_ = pfVar42[1] * fVar1;
                      auVar69._8_4_ = pfVar42[2] * fVar32;
                      auVar69._12_4_ = pfVar42[3] * fVar33;
                      *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                           auVar69;
                      lVar44 = lVar44 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar51 == uVar41) {
            if (iVar35 == 1 && (uVar3 == 1 && uVar4 == uVar50)) {
              Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar49) {
                  uVar37 = 0;
                  do {
                    if (0 < (int)local_a0) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      sVar8 = a->cstep;
                      pvVar10 = this_00->data;
                      pvVar43 = a[1].data;
                      sVar9 = a->elemsize;
                      pvVar58 = a->data;
                      lVar44 = 0;
                      iVar34 = (int)local_a0;
                      do {
                        pfVar42 = (float *)((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37);
                        fVar59 = *(float *)((long)pvVar43 + lVar44);
                        auVar76._0_4_ = fVar59 * *pfVar42;
                        auVar76._4_4_ = fVar59 * pfVar42[1];
                        auVar76._8_4_ = fVar59 * pfVar42[2];
                        auVar76._12_4_ = fVar59 * pfVar42[3];
                        *(undefined1 (*) [16])((long)pvVar10 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar76;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar36);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) {
LAB_003a7f29:
              local_7c = iVar35;
              Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = a[1].cstep;
                      sVar7 = a[1].elemsize;
                      pfVar42 = (float *)((long)a->data + a->cstep * uVar37 * a->elemsize);
                      fVar59 = *pfVar42;
                      fVar1 = pfVar42[1];
                      fVar32 = pfVar42[2];
                      fVar33 = pfVar42[3];
                      pvVar10 = a[1].data;
                      sVar8 = this_00->cstep;
                      sVar9 = this_00->elemsize;
                      pvVar43 = this_00->data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                        auVar90._0_4_ = *pfVar42 * fVar59;
                        auVar90._4_4_ = pfVar42[1] * fVar1;
                        auVar90._8_4_ = pfVar42[2] * fVar32;
                        auVar90._12_4_ = pfVar42[3] * fVar33;
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                             auVar90;
                        lVar44 = lVar44 + 0x10;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((iVar34 == 1) && (uVar4 == uVar50)) && (uVar49 == 1)) {
              local_7c = iVar35;
              Mat::create(this_00,uVar41,uVar50,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      pvVar10 = a->data;
                      pvVar43 = this_00->data;
                      sVar8 = a[1].cstep;
                      sVar9 = a[1].elemsize;
                      pvVar58 = a[1].data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        fVar59 = *(float *)((long)pvVar10 + lVar44);
                        pfVar42 = (float *)((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37);
                        auVar98._0_4_ = *pfVar42 * fVar59;
                        auVar98._4_4_ = pfVar42[1] * fVar59;
                        auVar98._8_4_ = pfVar42[2] * fVar59;
                        auVar98._12_4_ = pfVar42[3] * fVar59;
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar98;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) goto LAB_003a7f29;
          if ((((uVar51 ^ 1) == 0 && uVar4 == uVar50) && uVar49 == uVar3) && uVar41 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].cstep;
                    sVar7 = a[1].elemsize;
                    pvVar10 = a[1].data;
                    pauVar54 = (undefined1 (*) [16])
                               (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                    pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        pfVar56 = (float *)((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar49 = uVar41;
                        do {
                          auVar86._0_4_ = *pfVar42 * fVar59;
                          auVar86._4_4_ = pfVar42[1] * fVar1;
                          auVar86._8_4_ = pfVar42[2] * fVar32;
                          auVar86._12_4_ = pfVar42[3] * fVar33;
                          *pauVar54 = auVar86;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar51 == uVar41 && (uVar4 ^ 1) == 0) && uVar49 == uVar3) && uVar50 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].elemsize;
                    pvVar43 = (void *)(this_00->cstep * uVar37 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar58 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    sVar7 = a[1].cstep;
                    pvVar10 = a[1].data;
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          pfVar42 = (float *)((long)pvVar58 + lVar44);
                          pfVar56 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                          auVar92._0_4_ = *pfVar56 * *pfVar42;
                          auVar92._4_4_ = pfVar56[1] * pfVar42[1];
                          auVar92._8_4_ = pfVar56[2] * pfVar42[2];
                          auVar92._12_4_ = pfVar56[3] * pfVar42[3];
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar92;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar4 == uVar50) && (uVar51 != 1 && uVar41 == 1)) {
            local_7c = iVar35;
            local_78 = b;
            local_70 = a;
            Mat::create(this_00,uVar51,uVar50,uVar49,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = local_70->cstep;
                    sVar7 = local_70->elemsize;
                    pvVar10 = local_70->data;
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * uVar37 * local_b8->elemsize + (long)local_b8->data
                               );
                    pfVar42 = (float *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                       (long)local_70[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        pfVar56 = (float *)((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar41 = uVar51;
                        do {
                          auVar100._0_4_ = *pfVar42 * fVar59;
                          auVar100._4_4_ = pfVar42[1] * fVar1;
                          auVar100._8_4_ = pfVar42[2] * fVar32;
                          auVar100._12_4_ = pfVar42[3] * fVar33;
                          *pauVar54 = auVar100;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          local_7c = iVar35;
          local_78 = b;
          local_70 = a;
          if ((uVar50 == 1 && uVar3 == uVar49) && (uVar4 != 1 && uVar51 == uVar41)) {
            Mat::create(this_00,uVar41,uVar4,uVar49,sVar5,iVar35,(Allocator *)pOVar38);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar4) {
                    sVar5 = local_70->elemsize;
                    pvVar43 = (void *)(local_b8->cstep * uVar37 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar58 = (void *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                      (long)local_70[1].data);
                    sVar7 = local_70->cstep;
                    pvVar10 = local_70->data;
                    uVar50 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                          pfVar56 = (float *)((long)pvVar58 + lVar44);
                          auVar104._0_4_ = *pfVar56 * *pfVar42;
                          auVar104._4_4_ = pfVar56[1] * pfVar42[1];
                          auVar104._8_4_ = pfVar56[2] * pfVar42[2];
                          auVar104._12_4_ = pfVar56[3] * pfVar42[3];
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar104;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar4);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003a3b2e;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar42 = (float *)(a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pfVar56 = (float *)(a->cstep * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar41 = 0;
                      do {
                        if (0 < (int)uVar51) {
                          fVar59 = *pfVar56;
                          fVar1 = pfVar56[1];
                          fVar32 = pfVar56[2];
                          fVar33 = pfVar56[3];
                          uVar50 = uVar51;
                          do {
                            auVar62._0_4_ = *pfVar42 * fVar59;
                            auVar62._4_4_ = pfVar42[1] * fVar1;
                            auVar62._8_4_ = pfVar42[2] * fVar32;
                            auVar62._12_4_ = pfVar42[3] * fVar33;
                            *pauVar54 = auVar62;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        pfVar56 = pfVar56 + 4;
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar49) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pfVar42 = (float *)((long)local_78->data + uVar37 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = this_00->data;
                  sVar8 = a->cstep;
                  sVar9 = a->elemsize;
                  pvVar43 = a->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar42 = (float *)((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37);
                    auVar96._0_4_ = *pfVar42 * fVar59;
                    auVar96._4_4_ = pfVar42[1] * fVar1;
                    auVar96._8_4_ = pfVar42[2] * fVar32;
                    auVar96._12_4_ = pfVar42[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                         auVar96;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar36);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7b96;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar49) {
            uVar37 = 0;
            do {
              if (0 < (int)uVar50) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar41) {
                    fVar59 = *pfVar56;
                    fVar1 = pfVar56[1];
                    fVar32 = pfVar56[2];
                    fVar33 = pfVar56[3];
                    uVar51 = uVar41;
                    do {
                      auVar73._0_4_ = *pfVar42 * fVar59;
                      auVar73._4_4_ = pfVar42[1] * fVar1;
                      auVar73._8_4_ = pfVar42[2] * fVar32;
                      auVar73._12_4_ = pfVar42[3] * fVar33;
                      *pauVar54 = auVar73;
                      pfVar42 = pfVar42 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar51 = uVar51 - 1;
                    } while (uVar51 != 0);
                  }
                  pfVar56 = pfVar56 + 4;
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar50);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar36);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        pOVar38 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003a3b2e;
        local_b0 = (float *)uVar36;
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,iVar39,uVar49,(size_t)local_88,iVar34,(Allocator *)pOVar38
                   );
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = a[1].dims;
        if (iVar34 == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)(uint)local_b0) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  pfVar42 = (float *)((long)local_78->data + uVar37 * 0x10);
                  fVar59 = *pfVar42;
                  fVar1 = pfVar42[1];
                  fVar32 = pfVar42[2];
                  fVar33 = pfVar42[3];
                  pvVar10 = a->data;
                  sVar8 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar43 = this_00->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar42 = (float *)((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37);
                    auVar94._0_4_ = *pfVar42 * fVar59;
                    auVar94._4_4_ = pfVar42[1] * fVar1;
                    auVar94._8_4_ = pfVar42[2] * fVar32;
                    auVar94._12_4_ = pfVar42[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                         auVar94;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while ((float *)uVar37 != local_b0);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7b96;
        }
        if (iVar34 == 3) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        fVar59 = *pfVar56;
                        fVar1 = pfVar56[1];
                        fVar32 = pfVar56[2];
                        fVar33 = pfVar56[3];
                        uVar51 = uVar41;
                        do {
                          auVar88._0_4_ = *pfVar42 * fVar59;
                          auVar88._4_4_ = pfVar42[1] * fVar1;
                          auVar88._8_4_ = pfVar42[2] * fVar32;
                          auVar88._12_4_ = pfVar42[3] * fVar33;
                          *pauVar54 = auVar88;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      pfVar56 = pfVar56 + 4;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 2) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pfVar56 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pfVar42 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    fVar59 = *pfVar56;
                    fVar1 = pfVar56[1];
                    fVar32 = pfVar56[2];
                    fVar33 = pfVar56[3];
                    uVar49 = 0;
                    do {
                      uVar51 = uVar41;
                      if (0 < (int)uVar41) {
                        do {
                          auVar66._0_4_ = *pfVar42 * fVar59;
                          auVar66._4_4_ = pfVar42[1] * fVar1;
                          auVar66._8_4_ = pfVar42[2] * fVar32;
                          auVar66._12_4_ = pfVar42[3] * fVar33;
                          *pauVar54 = auVar66;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  pfVar56 = pfVar56 + 4;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 3:
    pMVar46 = b;
    goto LAB_003a37c1;
  case 4:
    if (a->dims - 1U < 4) {
      local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar34);
      local_98._0_8_ = opt;
      uVar41 = a->w;
      uVar50 = a->h;
      iVar39 = a->d;
      uVar49 = a->c;
      uVar36 = (ulong)uVar49;
      local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar50 * uVar41 * iVar39);
      local_88 = (float *)a->elemsize;
      uVar51 = a[1].w;
      uVar4 = a[1].h;
      iVar40 = a[1].d;
      uVar3 = a[1].c;
      uVar37 = (ulong)uVar3;
      iVar53 = uVar4 * uVar51 * iVar40;
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar41 == 1) {
          Mat::create_like(this_00,b,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar41 = iVar53 * iVar35;
              uVar36 = 0;
              do {
                pauVar54 = (undefined1 (*) [16])
                           (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                fVar59 = *a->data;
                if ((int)uVar41 < 4) {
                  uVar50 = 0;
                }
                else {
                  auVar60._4_4_ = fVar59;
                  auVar60._0_4_ = fVar59;
                  auVar60._8_4_ = fVar59;
                  auVar60._12_4_ = fVar59;
                  iVar34 = 3;
                  do {
                    auVar79 = maxps(*pauVar54,auVar60);
                    *pauVar47 = auVar79;
                    pauVar54 = pauVar54 + 1;
                    pauVar47 = pauVar47 + 1;
                    iVar34 = iVar34 + 4;
                    uVar50 = uVar41 & 0xfffffffc;
                  } while (iVar34 < (int)uVar41);
                }
                if (uVar41 - uVar50 != 0 && (int)uVar50 <= (int)uVar41) {
                  lVar44 = 0;
                  do {
                    fVar1 = *(float *)(*pauVar54 + lVar44 * 4);
                    if (*(float *)(*pauVar54 + lVar44 * 4) <= fVar59) {
                      fVar1 = fVar59;
                    }
                    *(float *)((long)*pauVar47 + lVar44 * 4) = fVar1;
                    lVar44 = lVar44 + 1;
                  } while (uVar41 - uVar50 != (int)lVar44);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar41,(size_t)local_88,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          if (iVar35 == 1 && a[1].w == 1) goto LAB_003a7aee;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>(a,b,this_00,pOVar38);
          break;
        case 2:
          Mat::create(this_00,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
          pauVar54 = (undefined1 (*) [16])this_00->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar47 = (undefined1 (*) [16])a->data;
              pauVar52 = (undefined1 (*) [16])a[1].data;
              uVar41 = 0;
              do {
                if (0 < (int)uVar51) {
                  auVar79 = *pauVar47;
                  uVar50 = uVar51;
                  do {
                    auVar68 = maxps(*pauVar52,auVar79);
                    *pauVar54 = auVar68;
                    pauVar52 = pauVar52 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)a->data + uVar36 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    auVar68 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)a->data + uVar36 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    auVar68 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      auVar79 = *pauVar52;
                      uVar50 = uVar51;
                      do {
                        auVar68 = maxps(*pauVar47,auVar79);
                        *pauVar54 = auVar68;
                        pauVar47 = pauVar47 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar4);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar79 = *pauVar52;
                      uVar41 = 0;
                      do {
                        uVar50 = uVar51;
                        if (0 < (int)uVar51) {
                          do {
                            auVar68 = maxps(*pauVar47,auVar79);
                            *pauVar54 = auVar68;
                            pauVar47 = pauVar47 + 1;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    pauVar52 = pauVar52 + 1;
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar41,uVar50,(size_t)local_88,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar41,uVar50,(size_t)local_88,(uint)local_b0,
                      *(Allocator **)(local_98._0_8_ + 8));
          pauVar54 = (undefined1 (*) [16])local_b8->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)local_b8->c * local_b8->cstep == 0) {
            return -100;
          }
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar50) {
              pauVar47 = (undefined1 (*) [16])a->data;
              pauVar52 = (undefined1 (*) [16])a[1].data;
              uVar49 = 0;
              do {
                if (0 < (int)uVar41) {
                  auVar79 = *pauVar52;
                  uVar51 = uVar41;
                  do {
                    auVar68 = maxps(*pauVar47,auVar79);
                    *pauVar54 = auVar68;
                    pauVar47 = pauVar47 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar51 = uVar51 - 1;
                  } while (uVar51 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar50);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          this_00 = local_b8;
LAB_003a7aee:
          iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_max>
                             (a,b,this_00,pOVar38);
          return iVar34;
        }
        if (a[1].dims != 2) {
          return 0;
        }
        pOVar38 = *(Option **)(local_98._0_8_ + 8);
LAB_003a38f9:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>
                           (a,b,this_00,pOVar38);
        return iVar34;
      case 3:
        if (a[1].dims == 3) {
          local_a8 = uVar37;
          if (uVar3 == uVar49 && ((uVar51 ^ 1) == 0 && (uVar4 ^ 1) == 0)) {
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)local_a0) {
                    sVar5 = this_00->cstep;
                    sVar7 = this_00->elemsize;
                    auVar79 = *(undefined1 (*) [16])
                               ((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
                    pvVar10 = this_00->data;
                    sVar8 = a->cstep;
                    sVar9 = a->elemsize;
                    pvVar43 = a->data;
                    lVar44 = 0;
                    iVar34 = (int)local_a0;
                    do {
                      auVar68 = maxps(*(undefined1 (*) [16])
                                       ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37),auVar79);
                      *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                           auVar68;
                      lVar44 = lVar44 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar51 == uVar41) {
            if (iVar35 == 1 && (uVar3 == 1 && uVar4 == uVar50)) {
              Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar49) {
                  uVar37 = 0;
                  do {
                    if (0 < (int)local_a0) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      sVar8 = a->cstep;
                      pvVar10 = this_00->data;
                      pvVar43 = a[1].data;
                      sVar9 = a->elemsize;
                      pvVar58 = a->data;
                      lVar44 = 0;
                      iVar34 = (int)local_a0;
                      do {
                        uVar2 = *(undefined4 *)((long)pvVar43 + lVar44);
                        auVar75._4_4_ = uVar2;
                        auVar75._0_4_ = uVar2;
                        auVar75._8_4_ = uVar2;
                        auVar75._12_4_ = uVar2;
                        auVar79 = maxps(auVar75,*(undefined1 (*) [16])
                                                 ((long)pvVar58 +
                                                 lVar44 * 4 + sVar8 * sVar9 * uVar37));
                        *(undefined1 (*) [16])((long)pvVar10 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar79;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar36);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) {
LAB_003a7e2e:
              local_7c = iVar35;
              Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = a[1].cstep;
                      sVar7 = a[1].elemsize;
                      auVar79 = *(undefined1 (*) [16])
                                 ((long)a->data + a->cstep * uVar37 * a->elemsize);
                      pvVar10 = a[1].data;
                      sVar8 = this_00->cstep;
                      sVar9 = this_00->elemsize;
                      pvVar43 = this_00->data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        auVar68 = maxps(*(undefined1 (*) [16])
                                         ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),auVar79);
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                             auVar68;
                        lVar44 = lVar44 + 0x10;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((iVar34 == 1) && (uVar4 == uVar50)) && (uVar49 == 1)) {
              local_7c = iVar35;
              Mat::create(this_00,uVar41,uVar50,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      pvVar10 = a->data;
                      pvVar43 = this_00->data;
                      sVar8 = a[1].cstep;
                      sVar9 = a[1].elemsize;
                      pvVar58 = a[1].data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        uVar2 = *(undefined4 *)((long)pvVar10 + lVar44);
                        auVar28._4_4_ = uVar2;
                        auVar28._0_4_ = uVar2;
                        auVar28._8_4_ = uVar2;
                        auVar28._12_4_ = uVar2;
                        auVar79 = maxps(*(undefined1 (*) [16])
                                         ((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37),
                                        auVar28);
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar79;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) goto LAB_003a7e2e;
          if ((((uVar51 ^ 1) == 0 && uVar4 == uVar50) && uVar49 == uVar3) && uVar41 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].cstep;
                    sVar7 = a[1].elemsize;
                    pvVar10 = a[1].data;
                    pauVar54 = (undefined1 (*) [16])
                               (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                    pauVar47 = (undefined1 (*) [16])
                               (a->cstep * uVar37 * a->elemsize + (long)a->data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        auVar79 = *(undefined1 (*) [16])
                                   ((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        uVar49 = uVar41;
                        do {
                          auVar68 = maxps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar51 == uVar41 && (uVar4 ^ 1) == 0) && uVar49 == uVar3) && uVar50 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].elemsize;
                    pvVar43 = (void *)(this_00->cstep * uVar37 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar58 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    sVar7 = a[1].cstep;
                    pvVar10 = a[1].data;
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          auVar79 = maxps(*(undefined1 (*) [16])
                                           ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),
                                          *(undefined1 (*) [16])((long)pvVar58 + lVar44));
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar79;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar4 == uVar50) && (uVar51 != 1 && uVar41 == 1)) {
            local_7c = iVar35;
            local_78 = b;
            local_70 = a;
            Mat::create(this_00,uVar51,uVar50,uVar49,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = local_70->cstep;
                    sVar7 = local_70->elemsize;
                    pvVar10 = local_70->data;
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * uVar37 * local_b8->elemsize + (long)local_b8->data
                               );
                    pauVar47 = (undefined1 (*) [16])
                               (local_70[1].cstep * uVar37 * local_70[1].elemsize +
                               (long)local_70[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        auVar79 = *(undefined1 (*) [16])
                                   ((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        uVar41 = uVar51;
                        do {
                          auVar68 = maxps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          local_7c = iVar35;
          local_78 = b;
          local_70 = a;
          if ((uVar50 == 1 && uVar3 == uVar49) && (uVar4 != 1 && uVar51 == uVar41)) {
            Mat::create(this_00,uVar41,uVar4,uVar49,sVar5,iVar35,(Allocator *)pOVar38);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar4) {
                    sVar5 = local_70->elemsize;
                    pvVar43 = (void *)(local_b8->cstep * uVar37 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar58 = (void *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                      (long)local_70[1].data);
                    sVar7 = local_70->cstep;
                    pvVar10 = local_70->data;
                    uVar50 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          auVar79 = maxps(*(undefined1 (*) [16])((long)pvVar58 + lVar44),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37));
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar79;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar4);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003a38f9;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])(a->cstep * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar41 = 0;
                      do {
                        if (0 < (int)uVar51) {
                          auVar79 = *pauVar52;
                          uVar50 = uVar51;
                          do {
                            auVar68 = maxps(*pauVar47,auVar79);
                            *pauVar54 = auVar68;
                            pauVar47 = pauVar47 + 1;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        pauVar52 = pauVar52 + 1;
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar49) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)local_78->data + uVar37 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a->cstep;
                  sVar9 = a->elemsize;
                  pvVar43 = a->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar68 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar36);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7aee;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar49) {
            uVar37 = 0;
            do {
              if (0 < (int)uVar50) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar41) {
                    auVar79 = *pauVar52;
                    uVar51 = uVar41;
                    do {
                      auVar68 = maxps(*pauVar47,auVar79);
                      *pauVar54 = auVar68;
                      pauVar47 = pauVar47 + 1;
                      pauVar54 = pauVar54 + 1;
                      uVar51 = uVar51 - 1;
                    } while (uVar51 != 0);
                  }
                  pauVar52 = pauVar52 + 1;
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar50);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar36);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        pOVar38 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003a38f9;
        local_b0 = (float *)uVar36;
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,iVar39,uVar49,(size_t)local_88,iVar34,(Allocator *)pOVar38
                   );
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = a[1].dims;
        if (iVar34 == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)(uint)local_b0) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)local_78->data + uVar37 * 0x10);
                  pvVar10 = a->data;
                  sVar8 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar43 = this_00->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar68 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),auVar79);
                    *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while ((float *)uVar37 != local_b0);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7aee;
        }
        if (iVar34 == 3) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           (a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        auVar79 = *pauVar52;
                        uVar51 = uVar41;
                        do {
                          auVar68 = maxps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      pauVar52 = pauVar52 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 2) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    auVar79 = *pauVar52;
                    uVar49 = 0;
                    do {
                      uVar51 = uVar41;
                      if (0 < (int)uVar41) {
                        do {
                          auVar68 = maxps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  pauVar52 = pauVar52 + 1;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 5:
    if (a->dims - 1U < 4) {
      local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar34);
      local_98._0_8_ = opt;
      uVar41 = a->w;
      uVar50 = a->h;
      iVar39 = a->d;
      uVar49 = a->c;
      uVar36 = (ulong)uVar49;
      local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar50 * uVar41 * iVar39);
      local_88 = (float *)a->elemsize;
      uVar51 = a[1].w;
      uVar4 = a[1].h;
      iVar40 = a[1].d;
      uVar3 = a[1].c;
      uVar37 = (ulong)uVar3;
      iVar53 = uVar4 * uVar51 * iVar40;
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar41 == 1) {
          Mat::create_like(this_00,b,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar41 = iVar53 * iVar35;
              uVar36 = 0;
              do {
                pauVar54 = (undefined1 (*) [16])
                           (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                fVar59 = *a->data;
                if ((int)uVar41 < 4) {
                  uVar50 = 0;
                }
                else {
                  auVar61._4_4_ = fVar59;
                  auVar61._0_4_ = fVar59;
                  auVar61._8_4_ = fVar59;
                  auVar61._12_4_ = fVar59;
                  iVar34 = 3;
                  do {
                    auVar79 = minps(*pauVar54,auVar61);
                    *pauVar47 = auVar79;
                    pauVar54 = pauVar54 + 1;
                    pauVar47 = pauVar47 + 1;
                    iVar34 = iVar34 + 4;
                    uVar50 = uVar41 & 0xfffffffc;
                  } while (iVar34 < (int)uVar41);
                }
                if (uVar41 - uVar50 != 0 && (int)uVar50 <= (int)uVar41) {
                  lVar44 = 0;
                  do {
                    fVar1 = *(float *)(*pauVar54 + lVar44 * 4);
                    if (fVar59 <= *(float *)(*pauVar54 + lVar44 * 4)) {
                      fVar1 = fVar59;
                    }
                    *(float *)((long)*pauVar47 + lVar44 * 4) = fVar1;
                    lVar44 = lVar44 + 1;
                  } while (uVar41 - uVar50 != (int)lVar44);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar41,(size_t)local_88,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          if (iVar35 == 1 && a[1].w == 1) goto LAB_003a7c76;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>(a,b,this_00,pOVar38);
          break;
        case 2:
          Mat::create(this_00,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
          pauVar54 = (undefined1 (*) [16])this_00->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar47 = (undefined1 (*) [16])a->data;
              pauVar52 = (undefined1 (*) [16])a[1].data;
              uVar41 = 0;
              do {
                if (0 < (int)uVar51) {
                  auVar79 = *pauVar47;
                  uVar50 = uVar51;
                  do {
                    auVar68 = minps(*pauVar52,auVar79);
                    *pauVar54 = auVar68;
                    pauVar52 = pauVar52 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)a->data + uVar36 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    auVar68 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar53) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)a->data + uVar36 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a[1].cstep;
                  sVar9 = a[1].elemsize;
                  pvVar43 = a[1].data;
                  lVar44 = 0;
                  iVar34 = iVar53;
                  do {
                    auVar68 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar36),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar36) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      auVar79 = *pauVar52;
                      uVar50 = uVar51;
                      do {
                        auVar68 = minps(*pauVar47,auVar79);
                        *pauVar54 = auVar68;
                        pauVar47 = pauVar47 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar4);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)a->w * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar79 = *pauVar52;
                      uVar41 = 0;
                      do {
                        uVar50 = uVar51;
                        if (0 < (int)uVar51) {
                          do {
                            auVar68 = minps(*pauVar47,auVar79);
                            *pauVar54 = auVar68;
                            pauVar47 = pauVar47 + 1;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    pauVar52 = pauVar52 + 1;
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar41,uVar50,(size_t)local_88,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar41,uVar50,(size_t)local_88,(uint)local_b0,
                      *(Allocator **)(local_98._0_8_ + 8));
          pauVar54 = (undefined1 (*) [16])local_b8->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)local_b8->c * local_b8->cstep == 0) {
            return -100;
          }
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar50) {
              pauVar47 = (undefined1 (*) [16])a->data;
              pauVar52 = (undefined1 (*) [16])a[1].data;
              uVar49 = 0;
              do {
                if (0 < (int)uVar41) {
                  auVar79 = *pauVar52;
                  uVar51 = uVar41;
                  do {
                    auVar68 = minps(*pauVar47,auVar79);
                    *pauVar54 = auVar68;
                    pauVar47 = pauVar47 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar51 = uVar51 - 1;
                  } while (uVar51 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar50);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          this_00 = local_b8;
LAB_003a7c76:
          iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_min>
                             (a,b,this_00,pOVar38);
          return iVar34;
        }
        if (a[1].dims != 2) {
          return 0;
        }
        pOVar38 = *(Option **)(local_98._0_8_ + 8);
LAB_003a4127:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>
                           (a,b,this_00,pOVar38);
        return iVar34;
      case 3:
        if (a[1].dims == 3) {
          local_a8 = uVar37;
          if (uVar3 == uVar49 && ((uVar51 ^ 1) == 0 && (uVar4 ^ 1) == 0)) {
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)local_a0) {
                    sVar5 = this_00->cstep;
                    sVar7 = this_00->elemsize;
                    auVar79 = *(undefined1 (*) [16])
                               ((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
                    pvVar10 = this_00->data;
                    sVar8 = a->cstep;
                    sVar9 = a->elemsize;
                    pvVar43 = a->data;
                    lVar44 = 0;
                    iVar34 = (int)local_a0;
                    do {
                      auVar68 = minps(*(undefined1 (*) [16])
                                       ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37),auVar79);
                      *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                           auVar68;
                      lVar44 = lVar44 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar51 == uVar41) {
            if (iVar35 == 1 && (uVar3 == 1 && uVar4 == uVar50)) {
              Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar49) {
                  uVar37 = 0;
                  do {
                    if (0 < (int)local_a0) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      sVar8 = a->cstep;
                      pvVar10 = this_00->data;
                      pvVar43 = a[1].data;
                      sVar9 = a->elemsize;
                      pvVar58 = a->data;
                      lVar44 = 0;
                      iVar34 = (int)local_a0;
                      do {
                        uVar2 = *(undefined4 *)((long)pvVar43 + lVar44);
                        auVar78._4_4_ = uVar2;
                        auVar78._0_4_ = uVar2;
                        auVar78._8_4_ = uVar2;
                        auVar78._12_4_ = uVar2;
                        auVar79 = minps(auVar78,*(undefined1 (*) [16])
                                                 ((long)pvVar58 +
                                                 lVar44 * 4 + sVar8 * sVar9 * uVar37));
                        *(undefined1 (*) [16])((long)pvVar10 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar79;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar36);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) {
LAB_003a811f:
              local_7c = iVar35;
              Mat::create(this_00,uVar51,uVar4,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = a[1].cstep;
                      sVar7 = a[1].elemsize;
                      auVar79 = *(undefined1 (*) [16])
                                 ((long)a->data + a->cstep * uVar37 * a->elemsize);
                      pvVar10 = a[1].data;
                      sVar8 = this_00->cstep;
                      sVar9 = this_00->elemsize;
                      pvVar43 = this_00->data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        auVar68 = minps(*(undefined1 (*) [16])
                                         ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),auVar79);
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                             auVar68;
                        lVar44 = lVar44 + 0x10;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((iVar34 == 1) && (uVar4 == uVar50)) && (uVar49 == 1)) {
              local_7c = iVar35;
              Mat::create(this_00,uVar41,uVar50,uVar3,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_a8) {
                  uVar37 = 0;
                  do {
                    if (0 < iVar53) {
                      sVar5 = this_00->cstep;
                      sVar7 = this_00->elemsize;
                      pvVar10 = a->data;
                      pvVar43 = this_00->data;
                      sVar8 = a[1].cstep;
                      sVar9 = a[1].elemsize;
                      pvVar58 = a[1].data;
                      lVar44 = 0;
                      iVar34 = iVar53;
                      do {
                        uVar2 = *(undefined4 *)((long)pvVar10 + lVar44);
                        auVar27._4_4_ = uVar2;
                        auVar27._0_4_ = uVar2;
                        auVar27._8_4_ = uVar2;
                        auVar27._12_4_ = uVar2;
                        auVar79 = minps(*(undefined1 (*) [16])
                                         ((long)pvVar58 + lVar44 * 4 + sVar8 * sVar9 * uVar37),
                                        auVar27);
                        *(undefined1 (*) [16])((long)pvVar43 + lVar44 * 4 + sVar5 * sVar7 * uVar37)
                             = auVar79;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != local_a8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if ((uVar41 == 1 && uVar50 == 1) && uVar3 == uVar49) goto LAB_003a811f;
          if ((((uVar51 ^ 1) == 0 && uVar4 == uVar50) && uVar49 == uVar3) && uVar41 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].cstep;
                    sVar7 = a[1].elemsize;
                    pvVar10 = a[1].data;
                    pauVar54 = (undefined1 (*) [16])
                               (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                    pauVar47 = (undefined1 (*) [16])
                               (a->cstep * uVar37 * a->elemsize + (long)a->data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        auVar79 = *(undefined1 (*) [16])
                                   ((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        uVar49 = uVar41;
                        do {
                          auVar68 = minps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar51 == uVar41 && (uVar4 ^ 1) == 0) && uVar49 == uVar3) && uVar50 != 1) {
            local_7c = iVar35;
            local_78 = b;
            Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = a[1].elemsize;
                    pvVar43 = (void *)(this_00->cstep * uVar37 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar58 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
                    sVar7 = a[1].cstep;
                    pvVar10 = a[1].data;
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          auVar79 = minps(*(undefined1 (*) [16])
                                           ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),
                                          *(undefined1 (*) [16])((long)pvVar58 + lVar44));
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar79;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar4 == uVar50) && (uVar51 != 1 && uVar41 == 1)) {
            local_7c = iVar35;
            local_78 = b;
            local_70 = a;
            Mat::create(this_00,uVar51,uVar50,uVar49,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar50) {
                    sVar5 = local_70->cstep;
                    sVar7 = local_70->elemsize;
                    pvVar10 = local_70->data;
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * uVar37 * local_b8->elemsize + (long)local_b8->data
                               );
                    pauVar47 = (undefined1 (*) [16])
                               (local_70[1].cstep * uVar37 * local_70[1].elemsize +
                               (long)local_70[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        auVar79 = *(undefined1 (*) [16])
                                   ((long)pvVar10 + uVar48 * 0x10 + sVar5 * uVar37 * sVar7);
                        uVar41 = uVar51;
                        do {
                          auVar68 = minps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar50);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          local_7c = iVar35;
          local_78 = b;
          local_70 = a;
          if ((uVar50 == 1 && uVar3 == uVar49) && (uVar4 != 1 && uVar51 == uVar41)) {
            Mat::create(this_00,uVar41,uVar4,uVar49,sVar5,iVar35,(Allocator *)pOVar38);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)uVar49) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar4) {
                    sVar5 = local_70->elemsize;
                    pvVar43 = (void *)(local_b8->cstep * uVar37 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar58 = (void *)(local_70[1].cstep * uVar37 * local_70[1].elemsize +
                                      (long)local_70[1].data);
                    sVar7 = local_70->cstep;
                    pvVar10 = local_70->data;
                    uVar50 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar44 = 0;
                        do {
                          auVar79 = minps(*(undefined1 (*) [16])((long)pvVar58 + lVar44),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37));
                          *(undefined1 (*) [16])((long)pvVar43 + lVar44) = auVar79;
                          lVar44 = lVar44 + 0x10;
                        } while ((ulong)uVar41 << 4 != lVar44);
                        pvVar43 = (void *)((long)pvVar43 + lVar44);
                        pvVar58 = (void *)((long)pvVar58 + lVar44);
                      }
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar4);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar36);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003a4127;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar51,uVar4,iVar40,uVar3,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              uVar36 = 0;
              do {
                if (0 < iVar40) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pauVar47 = (undefined1 (*) [16])
                             (a[1].cstep * uVar36 * a[1].elemsize + (long)a[1].data);
                  pauVar52 = (undefined1 (*) [16])(a->cstep * uVar36 * a->elemsize + (long)a->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar41 = 0;
                      do {
                        if (0 < (int)uVar51) {
                          auVar79 = *pauVar52;
                          uVar50 = uVar51;
                          do {
                            auVar68 = minps(*pauVar47,auVar79);
                            *pauVar54 = auVar68;
                            pauVar47 = pauVar47 + 1;
                            pauVar54 = pauVar54 + 1;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                        }
                        pauVar52 = pauVar52 + 1;
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar4);
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar40);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,uVar49,(size_t)local_88,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)uVar49) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)local_78->data + uVar37 * 0x10);
                  pvVar10 = this_00->data;
                  sVar8 = a->cstep;
                  sVar9 = a->elemsize;
                  pvVar43 = a->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar68 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37),auVar79);
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar36);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7c76;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar49) {
            uVar37 = 0;
            do {
              if (0 < (int)uVar50) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar41) {
                    auVar79 = *pauVar52;
                    uVar51 = uVar41;
                    do {
                      auVar68 = minps(*pauVar47,auVar79);
                      *pauVar54 = auVar68;
                      pauVar47 = pauVar47 + 1;
                      pauVar54 = pauVar54 + 1;
                      uVar51 = uVar51 - 1;
                    } while (uVar51 != 0);
                  }
                  pauVar52 = pauVar52 + 1;
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar50);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar36);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        pOVar38 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003a4127;
        local_b0 = (float *)uVar36;
        local_78 = b;
        Mat::create(this_00,uVar41,uVar50,iVar39,uVar49,(size_t)local_88,iVar34,(Allocator *)pOVar38
                   );
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = a[1].dims;
        if (iVar34 == 1) {
          if (iVar35 != 1 || a[1].w != 1) {
            if (0 < (int)(uint)local_b0) {
              uVar37 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar5 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar79 = *(undefined1 (*) [16])((long)local_78->data + uVar37 * 0x10);
                  pvVar10 = a->data;
                  sVar8 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar43 = this_00->data;
                  lVar44 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar68 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar10 + lVar44 + sVar5 * sVar7 * uVar37),auVar79);
                    *(undefined1 (*) [16])((long)pvVar43 + lVar44 + sVar8 * sVar9 * uVar37) =
                         auVar68;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar37 = uVar37 + 1;
              } while ((float *)uVar37 != local_b0);
              return 0;
            }
            return 0;
          }
          pOVar38 = *(Option **)(local_98._0_8_ + 8);
          b = local_78;
          goto LAB_003a7c76;
        }
        if (iVar34 == 3) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           (a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        auVar79 = *pauVar52;
                        uVar51 = uVar41;
                        do {
                          auVar68 = minps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      pauVar52 = pauVar52 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 2) {
          if (0 < (int)(uint)local_b0) {
            uVar37 = 0;
            do {
              if (0 < iVar39) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
                pauVar52 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
                pauVar47 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar50) {
                    auVar79 = *pauVar52;
                    uVar49 = 0;
                    do {
                      uVar51 = uVar41;
                      if (0 < (int)uVar41) {
                        do {
                          auVar68 = minps(*pauVar47,auVar79);
                          *pauVar54 = auVar68;
                          pauVar47 = pauVar47 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar51 = uVar51 - 1;
                        } while (uVar51 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar50);
                  }
                  pauVar52 = pauVar52 + 1;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar39);
              }
              uVar37 = uVar37 + 1;
            } while ((float *)uVar37 != local_b0);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 6:
    if (a->dims - 1U < 4) {
      uVar41 = a->w;
      local_88 = (float *)(ulong)uVar41;
      uVar50 = a->h;
      local_a0 = (float *)(ulong)uVar50;
      iVar39 = a->d;
      uVar49 = a->c;
      uVar37 = (ulong)uVar49;
      local_68 = CONCAT44(local_68._4_4_,uVar50 * uVar41 * iVar39);
      local_38 = a->elemsize;
      local_b0._0_4_ = a[1].w;
      uVar51 = a[1].h;
      iVar40 = a[1].d;
      uVar4 = a[1].c;
      uVar36 = (ulong)uVar4;
      local_a8 = CONCAT44(local_a8._4_4_,iVar40);
      local_78 = (Mat *)CONCAT44(local_78._4_4_,uVar51 * (uint)local_b0 * iVar40);
      sVar5 = a[1].elemsize;
      local_98._0_4_ = uVar51;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar41 == 1) {
          local_70 = a;
          local_68 = uVar36;
          Mat::create_like(this_00,b,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_68) {
            iVar35 = (int)local_78 * iVar35;
            local_b0 = (float *)0x0;
            local_78 = (Mat *)CONCAT44(local_78._4_4_,iVar35);
            do {
              pfVar42 = (float *)(local_70[1].cstep * (long)local_b0 * local_70[1].elemsize +
                                 (long)local_70[1].data);
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * (long)local_b0 * this_00->elemsize + (long)this_00->data)
              ;
              fStack_44 = *local_70->data;
              local_98 = ZEXT416((uint)fStack_44);
              local_48 = fStack_44;
              fStack_3c = fStack_44;
              fStack_40 = fStack_44;
              if (iVar35 < 4) {
                iVar34 = 0;
              }
              else {
                iVar39 = 0;
                do {
                  _local_58 = *(undefined8 *)pfVar42;
                  _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                  afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                       (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                  auVar26._8_4_ = extraout_XMM0_Dc;
                  auVar26._0_8_ = afVar108._0_8_;
                  auVar26._12_4_ = extraout_XMM0_Dd;
                  *pauVar54 = auVar26;
                  pfVar42 = pfVar42 + 4;
                  pauVar54 = pauVar54 + 1;
                  iVar34 = iVar39 + 4;
                  iVar40 = iVar39 + 7;
                  iVar39 = iVar34;
                } while (iVar40 < iVar35);
              }
              if (iVar34 < iVar35) {
                lVar44 = 0;
                do {
                  fVar59 = powf((float)local_98._0_4_,pfVar42[lVar44]);
                  *(float *)((long)*pauVar54 + lVar44 * 4) = fVar59;
                  lVar44 = lVar44 + 1;
                } while (iVar35 - iVar34 != (int)lVar44);
              }
              local_b0 = (float *)((long)local_b0 + 1);
              this_00 = local_b8;
              iVar35 = (int)local_78;
            } while (local_b0 != (float *)local_68);
          }
        }
        else {
          switch(a[1].dims) {
          case 1:
            local_70 = a;
            Mat::create(this_00,uVar41,local_38,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pOVar38 = (Option *)opt->blob_allocator;
            if (iVar35 == 1 && local_70[1].w == 1) goto LAB_003a7d15;
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>
                      (local_70,b,local_b8,pOVar38);
            break;
          case 2:
            local_70 = a;
            Mat::create(this_00,(uint)local_b0,uVar51,sVar5,iVar35,opt->blob_allocator);
            pauVar54 = (undefined1 (*) [16])this_00->data;
            if (pauVar54 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_98._0_4_) {
                local_a0 = (float *)local_70->data;
                pfVar42 = (float *)local_70[1].data;
                local_88 = (float *)((ulong)local_88 & 0xffffffff00000000);
                do {
                  _local_48 = *(undefined8 *)local_a0;
                  _fStack_40 = *(undefined8 *)(local_a0 + 2);
                  uVar41 = (uint)local_b0;
                  if (0 < (int)(uint)local_b0) {
                    do {
                      _local_58 = *(undefined8 *)pfVar42;
                      _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                      afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                      auVar31._8_4_ = extraout_XMM0_Dc_09;
                      auVar31._0_8_ = afVar108._0_8_;
                      auVar31._12_4_ = extraout_XMM0_Dd_09;
                      *pauVar54 = auVar31;
                      pfVar42 = pfVar42 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar41 = uVar41 - 1;
                    } while (uVar41 != 0);
                  }
                  local_a0 = local_a0 + 4;
                  iVar34 = (int)local_88 + 1;
                  local_88 = (float *)CONCAT44(local_88._4_4_,iVar34);
                } while (iVar34 != local_98._0_4_);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            local_70 = a;
            Mat::create(this_00,(uint)local_b0,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar4) {
                local_b0 = (float *)0x0;
                local_68 = uVar36;
                do {
                  pfVar42 = (float *)((long)local_70->data + (long)local_b0 * 0x10);
                  _local_48 = *(undefined8 *)pfVar42;
                  _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                  if (0 < (int)local_78) {
                    local_98._0_8_ =
                         (void *)(local_b8->cstep * local_b8->elemsize * (long)local_b0 +
                                 (long)local_b8->data);
                    lVar44 = local_70[1].cstep * local_70[1].elemsize * (long)local_b0;
                    pvVar10 = local_70[1].data;
                    lVar45 = 0;
                    iVar34 = (int)local_78;
                    do {
                      pfVar42 = (float *)((long)pvVar10 + lVar45 + lVar44);
                      _local_58 = *(undefined8 *)pfVar42;
                      _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                      afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                      auVar30._8_4_ = extraout_XMM0_Dc_07;
                      auVar30._0_8_ = afVar108._0_8_;
                      auVar30._12_4_ = extraout_XMM0_Dd_07;
                      *(undefined1 (*) [16])(local_98._0_8_ + lVar45) = auVar30;
                      lVar45 = lVar45 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  local_b0 = (float *)((long)local_b0 + 1);
                } while (local_b0 != (float *)local_68);
                return 0;
              }
              return 0;
            }
            return -100;
          case 4:
            local_70 = a;
            Mat::create(this_00,(uint)local_b0,uVar51,iVar40,uVar4,sVar5,iVar35,opt->blob_allocator)
            ;
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar4) {
                local_b0 = (float *)0x0;
                local_68 = uVar36;
                do {
                  pfVar42 = (float *)((long)local_70->data + (long)local_b0 * 0x10);
                  _local_48 = *(undefined8 *)pfVar42;
                  _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                  if (0 < (int)local_78) {
                    local_98._0_8_ =
                         (void *)(local_b8->cstep * local_b8->elemsize * (long)local_b0 +
                                 (long)local_b8->data);
                    lVar44 = local_70[1].cstep * local_70[1].elemsize * (long)local_b0;
                    pvVar10 = local_70[1].data;
                    lVar45 = 0;
                    iVar34 = (int)local_78;
                    do {
                      pfVar42 = (float *)((long)pvVar10 + lVar45 + lVar44);
                      _local_58 = *(undefined8 *)pfVar42;
                      _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                      afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                      auVar29._8_4_ = extraout_XMM0_Dc_08;
                      auVar29._0_8_ = afVar108._0_8_;
                      auVar29._12_4_ = extraout_XMM0_Dd_08;
                      *(undefined1 (*) [16])(local_98._0_8_ + lVar45) = auVar29;
                      lVar45 = lVar45 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  local_b0 = (float *)((long)local_b0 + 1);
                } while (local_b0 != (float *)local_68);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_70 = a;
          Mat::create(this_00,(uint)local_b0,uVar51,uVar4,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              local_a8 = 0;
              iVar34 = local_98._0_4_;
              local_68 = uVar36;
              do {
                if (0 < iVar34) {
                  pauVar54 = (undefined1 (*) [16])
                             (local_b8->cstep * local_a8 * local_b8->elemsize + (long)local_b8->data
                             );
                  pfVar42 = (float *)(local_70[1].cstep * local_a8 * local_70[1].elemsize +
                                     (long)local_70[1].data);
                  local_a0 = (float *)((long)local_70->w * local_a8 * local_70->elemsize +
                                      (long)local_70->data);
                  iVar35 = 0;
                  do {
                    local_88 = (float *)CONCAT44(local_88._4_4_,iVar35);
                    _local_48 = *(undefined8 *)local_a0;
                    _fStack_40 = *(undefined8 *)(local_a0 + 2);
                    uVar41 = (uint)local_b0;
                    if (0 < (int)(uint)local_b0) {
                      do {
                        _local_58 = *(undefined8 *)pfVar42;
                        _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                        afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                        auVar25._8_4_ = extraout_XMM0_Dc_04;
                        auVar25._0_8_ = afVar108._0_8_;
                        auVar25._12_4_ = extraout_XMM0_Dd_04;
                        *pauVar54 = auVar25;
                        pfVar42 = pfVar42 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar41 = uVar41 - 1;
                      } while (uVar41 != 0);
                    }
                    local_a0 = local_a0 + 4;
                    iVar35 = (int)local_88 + 1;
                    iVar34 = local_98._0_4_;
                  } while (iVar35 != local_98._0_4_);
                }
                local_a8 = local_a8 + 1;
              } while (local_a8 != local_68);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_70 = a;
          Mat::create(this_00,(uint)local_b0,uVar51,iVar40,uVar4,sVar5,iVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              local_60 = 0;
              iVar34 = local_98._0_4_;
              local_68 = uVar36;
              do {
                if (0 < (int)local_a8) {
                  pauVar54 = (undefined1 (*) [16])
                             (local_b8->cstep * local_60 * local_b8->elemsize + (long)local_b8->data
                             );
                  pfVar42 = (float *)(local_70[1].cstep * local_60 * local_70[1].elemsize +
                                     (long)local_70[1].data);
                  local_88 = (float *)((long)local_70->w * local_60 * local_70->elemsize +
                                      (long)local_70->data);
                  iVar35 = 0;
                  do {
                    local_78 = (Mat *)CONCAT44(local_78._4_4_,iVar35);
                    _local_48 = *(undefined8 *)local_88;
                    _fStack_40 = *(undefined8 *)(local_88 + 2);
                    if (0 < iVar34) {
                      iVar35 = 0;
                      do {
                        local_a0 = (float *)CONCAT44(local_a0._4_4_,iVar35);
                        uVar41 = (uint)local_b0;
                        if (0 < (int)(uint)local_b0) {
                          do {
                            _local_58 = *(undefined8 *)pfVar42;
                            _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                            afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                                 (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58)
                            ;
                            auVar23._8_4_ = extraout_XMM0_Dc_01;
                            auVar23._0_8_ = afVar108._0_8_;
                            auVar23._12_4_ = extraout_XMM0_Dd_01;
                            *pauVar54 = auVar23;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar41 = uVar41 - 1;
                          } while (uVar41 != 0);
                        }
                        iVar35 = (int)local_a0 + 1;
                        iVar34 = local_98._0_4_;
                      } while (iVar35 != local_98._0_4_);
                    }
                    local_88 = local_88 + 4;
                    iVar35 = (int)local_78 + 1;
                  } while (iVar35 != (int)local_a8);
                }
                local_60 = local_60 + 1;
              } while (local_60 != local_68);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_70 = a;
        Mat::create(this_00,uVar41,uVar50,local_38,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_70[1].dims == 1) {
          Mat::create(this_00,uVar41,(int)local_a0,local_38,iVar34,opt->blob_allocator);
          pauVar54 = (undefined1 (*) [16])local_b8->data;
          if (pauVar54 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)local_b8->c * local_b8->cstep == 0) {
            return -100;
          }
          if (iVar35 != 1 || local_70[1].w != 1) {
            if (0 < (int)local_a0) {
              pfVar42 = (float *)local_70->data;
              local_98._0_8_ = local_70[1].data;
              local_b0 = (float *)((ulong)local_b0._4_4_ << 0x20);
              do {
                _local_48 = *(undefined8 *)local_98._0_8_;
                _fStack_40 = *(undefined8 *)(local_98._0_8_ + 8);
                uVar37 = (ulong)local_88 & 0xffffffff;
                if (0 < (int)local_88) {
                  do {
                    _local_58 = *(undefined8 *)pfVar42;
                    _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                    afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                    auVar24._8_4_ = extraout_XMM0_Dc_18;
                    auVar24._0_8_ = afVar108._0_8_;
                    auVar24._12_4_ = extraout_XMM0_Dd_18;
                    *pauVar54 = auVar24;
                    pfVar42 = pfVar42 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar41 = (int)uVar37 - 1;
                    uVar37 = (ulong)uVar41;
                  } while (uVar41 != 0);
                }
                local_98._0_8_ = local_98._0_8_ + 0x10;
                iVar34 = (uint)local_b0 + 1;
                local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar34);
              } while (iVar34 != (int)local_a0);
              return 0;
            }
            return 0;
          }
          pOVar38 = (Option *)opt->blob_allocator;
LAB_003a7d15:
          iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_pow>
                             (local_70,b,local_b8,pOVar38);
          return iVar34;
        }
        if (local_70[1].dims != 2) {
          return 0;
        }
        pOVar38 = (Option *)opt->blob_allocator;
        a = local_70;
LAB_003a4158:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>
                           (a,b,local_b8,pOVar38);
        return iVar34;
      case 3:
        if (a[1].dims == 3) {
          local_a8 = sVar5;
          if (uVar4 == uVar49 && (((uint)local_b0 ^ 1) == 0 && (uVar51 ^ 1) == 0)) {
            local_70 = a;
            Mat::create(this_00,uVar41,uVar50,uVar49,local_38,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar49) {
                local_b0 = (float *)0x0;
                local_60 = uVar37;
                do {
                  local_98._0_8_ = local_70->data;
                  pvVar10 = local_b8->data;
                  pfVar42 = (float *)((long)local_70[1].data +
                                     local_70[1].cstep * (long)local_b0 * local_70[1].elemsize);
                  _local_48 = *(undefined8 *)pfVar42;
                  _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                  if (0 < (int)local_68) {
                    lVar44 = local_b8->cstep * local_b8->elemsize * (long)local_b0;
                    local_98._0_8_ =
                         (void *)((long)local_70->data +
                                 local_70->cstep * local_70->elemsize * (long)local_b0);
                    lVar45 = 0;
                    iVar34 = (int)local_68;
                    do {
                      _local_58 = *(undefined8 *)(local_98._0_8_ + lVar45);
                      _fStack_50 = *(undefined8 *)((float *)(local_98._0_8_ + lVar45) + 2);
                      afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                      auVar15._8_4_ = extraout_XMM0_Dc_03;
                      auVar15._0_8_ = afVar108._0_8_;
                      auVar15._12_4_ = extraout_XMM0_Dd_03;
                      *(undefined1 (*) [16])((long)pvVar10 + lVar45 + lVar44) = auVar15;
                      lVar45 = lVar45 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  local_b0 = (float *)((long)local_b0 + 1);
                } while (local_b0 != (float *)local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uint)local_b0 == uVar41) {
            if (iVar35 == 1 && (uVar4 == 1 && uVar51 == uVar50)) {
              local_70 = a;
              Mat::create(this_00,uVar41,uVar50,uVar49,local_38,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar49) {
                  local_a0 = (float *)0x0;
                  local_60 = uVar37;
                  do {
                    if (0 < (int)local_68) {
                      local_98._0_8_ =
                           (void *)(local_b8->cstep * local_b8->elemsize * (long)local_a0 +
                                   (long)local_b8->data);
                      local_b0 = (float *)local_70[1].data;
                      lVar45 = local_70->cstep * local_70->elemsize * (long)local_a0;
                      pvVar10 = local_70->data;
                      lVar44 = 0;
                      iVar34 = (int)local_68;
                      do {
                        pfVar42 = (float *)((long)pvVar10 + lVar44 * 4 + lVar45);
                        _local_48 = *(undefined8 *)pfVar42;
                        _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                        fStack_54 = *(float *)((long)local_b0 + lVar44);
                        local_58 = fStack_54;
                        fStack_4c = fStack_54;
                        fStack_50 = fStack_54;
                        afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                        auVar16._8_4_ = extraout_XMM0_Dc_06;
                        auVar16._0_8_ = afVar108._0_8_;
                        auVar16._12_4_ = extraout_XMM0_Dd_06;
                        *(undefined1 (*) [16])(local_98._0_8_ + lVar44 * 4) = auVar16;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    local_a0 = (float *)((long)local_a0 + 1);
                  } while (local_a0 != (float *)local_60);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar41 == 1 && uVar50 == 1) && uVar4 == uVar49) {
LAB_003a8215:
              local_7c = iVar35;
              local_70 = a;
              Mat::create(this_00,(uint)local_b0,uVar51,uVar4,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar4) {
                  local_b0 = (float *)0x0;
                  local_68 = uVar36;
                  do {
                    local_98._0_8_ = local_b8->data;
                    pvVar10 = local_70[1].data;
                    pfVar42 = (float *)((long)local_70->data +
                                       local_70->cstep * (long)local_b0 * local_70->elemsize);
                    _local_48 = *(undefined8 *)pfVar42;
                    _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                    if (0 < (int)local_78) {
                      lVar44 = local_70[1].cstep * local_70[1].elemsize * (long)local_b0;
                      local_98._0_8_ =
                           (void *)((long)local_b8->data +
                                   local_b8->cstep * local_b8->elemsize * (long)local_b0);
                      lVar45 = 0;
                      iVar34 = (int)local_78;
                      do {
                        pfVar42 = (float *)((long)pvVar10 + lVar45 + lVar44);
                        _local_58 = *(undefined8 *)pfVar42;
                        _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                        afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                        auVar17._8_4_ = extraout_XMM0_Dc_12;
                        auVar17._0_8_ = afVar108._0_8_;
                        auVar17._12_4_ = extraout_XMM0_Dd_12;
                        *(undefined1 (*) [16])(local_98._0_8_ + lVar45) = auVar17;
                        lVar45 = lVar45 + 0x10;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    local_b0 = (float *)((long)local_b0 + 1);
                  } while (local_b0 != (float *)local_68);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_68 = uVar36;
            if (((iVar34 == 1) && (uVar51 == uVar50)) && (uVar49 == 1)) {
              local_7c = iVar35;
              local_70 = a;
              Mat::create(this_00,uVar41,uVar50,uVar4,sVar5,iVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_68) {
                  local_a0 = (float *)0x0;
                  do {
                    if (0 < (int)local_78) {
                      local_b0 = (float *)local_70->data;
                      local_98._0_8_ =
                           (void *)(local_b8->cstep * local_b8->elemsize * (long)local_a0 +
                                   (long)local_b8->data);
                      lVar45 = local_70[1].cstep * local_70[1].elemsize * (long)local_a0;
                      pvVar10 = local_70[1].data;
                      lVar44 = 0;
                      iVar34 = (int)local_78;
                      do {
                        fStack_44 = *(float *)((long)local_b0 + lVar44);
                        local_48 = fStack_44;
                        fStack_3c = fStack_44;
                        fStack_40 = fStack_44;
                        pfVar42 = (float *)((long)pvVar10 + lVar44 * 4 + lVar45);
                        _local_58 = *(undefined8 *)pfVar42;
                        _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                        afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                        auVar18._8_4_ = extraout_XMM0_Dc_16;
                        auVar18._0_8_ = afVar108._0_8_;
                        auVar18._12_4_ = extraout_XMM0_Dd_16;
                        *(undefined1 (*) [16])(local_98._0_8_ + lVar44 * 4) = auVar18;
                        lVar44 = lVar44 + 4;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    local_a0 = (float *)((long)local_a0 + 1);
                  } while (local_a0 != (float *)local_68);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if ((uVar41 == 1 && uVar50 == 1) && uVar4 == uVar49) goto LAB_003a8215;
          if (((((uint)local_b0 ^ 1) == 0 && uVar51 == uVar50) && uVar49 == uVar4) && uVar41 != 1) {
            local_7c = iVar35;
            local_70 = a;
            local_60 = uVar37;
            Mat::create(this_00,uVar41,uVar50,uVar49,local_38,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_60) {
                local_a8 = 0;
                do {
                  if (0 < (int)local_a0) {
                    local_b0 = (float *)(local_70[1].cstep * local_a8 * local_70[1].elemsize +
                                        (long)local_70[1].data);
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * local_a8 * local_b8->elemsize +
                               (long)local_b8->data);
                    pfVar42 = (float *)(local_70->cstep * local_a8 * local_70->elemsize +
                                       (long)local_70->data);
                    uVar37 = 0;
                    do {
                      local_98._0_8_ = uVar37;
                      pfVar56 = (float *)((long)local_b0 + uVar37 * 0x10);
                      _local_48 = *(undefined8 *)pfVar56;
                      _fStack_40 = *(undefined8 *)(pfVar56 + 2);
                      uVar37 = (ulong)local_88 & 0xffffffff;
                      if (0 < (int)local_88) {
                        do {
                          _local_58 = *(undefined8 *)pfVar42;
                          _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                          auVar19._8_4_ = extraout_XMM0_Dc_10;
                          auVar19._0_8_ = afVar108._0_8_;
                          auVar19._12_4_ = extraout_XMM0_Dd_10;
                          *pauVar54 = auVar19;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = (int)uVar37 - 1;
                          uVar37 = (ulong)uVar41;
                        } while (uVar41 != 0);
                      }
                      uVar37 = local_98._0_8_ + 1;
                    } while ((float *)uVar37 != local_a0);
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 != local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((uint)local_b0 == uVar41 && (uVar51 ^ 1) == 0) && uVar49 == uVar4) && uVar50 != 1) {
            local_7c = iVar35;
            local_70 = a;
            local_60 = uVar37;
            Mat::create(this_00,uVar41,uVar50,uVar49,local_38,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_60) {
                lVar44 = (long)local_88 << 4;
                local_a8 = 0;
                local_b0 = (float *)lVar44;
                do {
                  if (0 < (int)local_a0) {
                    pvVar58 = (void *)(local_b8->cstep * local_a8 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar43 = (void *)(local_70->cstep * local_a8 * local_70->elemsize +
                                      (long)local_70->data);
                    lVar45 = local_70[1].elemsize * local_70[1].cstep * local_a8;
                    pvVar10 = local_70[1].data;
                    iVar34 = 0;
                    pfVar42 = local_88;
                    do {
                      if (0 < (int)pfVar42) {
                        local_98._0_4_ = iVar34;
                        lVar55 = 0;
                        do {
                          _local_48 = *(undefined8 *)((long)pvVar43 + lVar55);
                          _fStack_40 = *(undefined8 *)((float *)((long)pvVar43 + lVar55) + 2);
                          pfVar42 = (float *)((long)pvVar10 + lVar55 + lVar45);
                          _local_58 = *(undefined8 *)pfVar42;
                          _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                          auVar20._8_4_ = extraout_XMM0_Dc_13;
                          auVar20._0_8_ = afVar108._0_8_;
                          auVar20._12_4_ = extraout_XMM0_Dd_13;
                          *(undefined1 (*) [16])((long)pvVar58 + lVar55) = auVar20;
                          lVar55 = lVar55 + 0x10;
                        } while (lVar44 != lVar55);
                        pvVar58 = (void *)((long)pvVar58 + lVar55);
                        pvVar43 = (void *)((long)pvVar43 + lVar55);
                        pfVar42 = local_88;
                        iVar34 = local_98._0_4_;
                      }
                      iVar34 = iVar34 + 1;
                    } while (iVar34 != (int)local_a0);
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 != local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar4 == uVar49 && uVar51 == uVar50) && ((uint)local_b0 != 1 && uVar41 == 1)) {
            local_7c = iVar35;
            local_70 = a;
            local_60 = uVar37;
            Mat::create(this_00,(uint)local_b0,uVar50,uVar49,sVar5,iVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)local_60) {
                local_a8 = 0;
                do {
                  if (0 < (int)local_a0) {
                    local_88 = (float *)(local_70->cstep * local_a8 * local_70->elemsize +
                                        (long)local_70->data);
                    pauVar54 = (undefined1 (*) [16])
                               (local_b8->cstep * local_a8 * local_b8->elemsize +
                               (long)local_b8->data);
                    pfVar42 = (float *)(local_70[1].cstep * local_a8 * local_70[1].elemsize +
                                       (long)local_70[1].data);
                    uVar37 = 0;
                    do {
                      local_98._0_8_ = uVar37;
                      pfVar56 = (float *)((long)local_88 + uVar37 * 0x10);
                      _local_48 = *(undefined8 *)pfVar56;
                      _fStack_40 = *(undefined8 *)(pfVar56 + 2);
                      uVar41 = (uint)local_b0;
                      if (0 < (int)(uint)local_b0) {
                        do {
                          _local_58 = *(undefined8 *)pfVar42;
                          _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                          auVar21._8_4_ = extraout_XMM0_Dc_17;
                          auVar21._0_8_ = afVar108._0_8_;
                          auVar21._12_4_ = extraout_XMM0_Dd_17;
                          *pauVar54 = auVar21;
                          pfVar42 = pfVar42 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                      }
                      uVar37 = local_98._0_8_ + 1;
                    } while ((float *)uVar37 != local_a0);
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 != local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          local_7c = iVar35;
          local_70 = a;
          local_60 = uVar37;
          if ((uVar50 == 1 && uVar4 == uVar49) && (uVar51 != 1 && (uint)local_b0 == uVar41)) {
            Mat::create(this_00,uVar41,uVar51,uVar49,sVar5,iVar35,(Allocator *)pOVar38);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_b8->c * local_b8->cstep != 0) {
              if (0 < (int)local_60) {
                lVar44 = (long)local_88 << 4;
                local_a8 = 0;
                iVar34 = local_98._0_4_;
                local_a0 = (float *)lVar44;
                do {
                  if (0 < iVar34) {
                    pvVar58 = (void *)(local_b8->cstep * local_a8 * local_b8->elemsize +
                                      (long)local_b8->data);
                    pvVar43 = (void *)(local_70[1].cstep * local_a8 * local_70[1].elemsize +
                                      (long)local_70[1].data);
                    lVar45 = local_70->elemsize * local_70->cstep * local_a8;
                    pvVar10 = local_70->data;
                    local_b0._0_4_ = 0;
                    pfVar42 = local_88;
                    do {
                      if (0 < (int)pfVar42) {
                        lVar55 = 0;
                        do {
                          pfVar42 = (float *)((long)pvVar10 + lVar55 + lVar45);
                          _local_48 = *(undefined8 *)pfVar42;
                          _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                          _local_58 = *(undefined8 *)((long)pvVar43 + lVar55);
                          _fStack_50 = *(undefined8 *)((float *)((long)pvVar43 + lVar55) + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58);
                          auVar22._8_4_ = extraout_XMM0_Dc_19;
                          auVar22._0_8_ = afVar108._0_8_;
                          auVar22._12_4_ = extraout_XMM0_Dd_19;
                          *(undefined1 (*) [16])((long)pvVar58 + lVar55) = auVar22;
                          lVar55 = lVar55 + 0x10;
                        } while (lVar44 != lVar55);
                        pvVar58 = (void *)((long)pvVar58 + lVar55);
                        pvVar43 = (void *)((long)pvVar43 + lVar55);
                        pfVar42 = local_88;
                        iVar34 = local_98._0_4_;
                      }
                      local_b0._0_4_ = (uint)local_b0 + 1;
                    } while ((uint)local_b0 != iVar34);
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 != local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003a4158;
        }
        if (a[1].dims == 4) {
          local_70 = a;
          Mat::create(this_00,(uint)local_b0,uVar51,iVar40,uVar4,sVar5,iVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              local_60 = 0;
              iVar34 = local_98._0_4_;
              local_68 = uVar36;
              do {
                if (0 < (int)local_a8) {
                  pauVar54 = (undefined1 (*) [16])
                             (local_b8->cstep * local_60 * local_b8->elemsize + (long)local_b8->data
                             );
                  pfVar42 = (float *)(local_70[1].cstep * local_60 * local_70[1].elemsize +
                                     (long)local_70[1].data);
                  local_a0 = (float *)(local_70->cstep * local_60 * local_70->elemsize +
                                      (long)local_70->data);
                  iVar35 = 0;
                  do {
                    local_78 = (Mat *)CONCAT44(local_78._4_4_,iVar35);
                    if (0 < iVar34) {
                      iVar35 = 0;
                      do {
                        local_88 = (float *)CONCAT44(local_88._4_4_,iVar35);
                        _local_48 = *(undefined8 *)local_a0;
                        _fStack_40 = *(undefined8 *)(local_a0 + 2);
                        uVar41 = (uint)local_b0;
                        if (0 < (int)(uint)local_b0) {
                          do {
                            _local_58 = *(undefined8 *)pfVar42;
                            _fStack_50 = *(undefined8 *)(pfVar42 + 2);
                            afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                                 (&local_b9,(__m128 *)&local_48,(__m128 *)&local_58)
                            ;
                            auVar12._8_4_ = extraout_XMM0_Dc_00;
                            auVar12._0_8_ = afVar108._0_8_;
                            auVar12._12_4_ = extraout_XMM0_Dd_00;
                            *pauVar54 = auVar12;
                            pfVar42 = pfVar42 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar41 = uVar41 - 1;
                          } while (uVar41 != 0);
                        }
                        local_a0 = local_a0 + 4;
                        iVar35 = (int)local_88 + 1;
                        iVar34 = local_98._0_4_;
                      } while (iVar35 != local_98._0_4_);
                    }
                    iVar35 = (int)local_78 + 1;
                  } while (iVar35 != (int)local_a8);
                }
                local_60 = local_60 + 1;
              } while (local_60 != local_68);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_70 = a;
        local_60 = uVar37;
        Mat::create(this_00,uVar41,uVar50,uVar49,local_38,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_70[1].dims == 1) {
          if (iVar35 != 1 || local_70[1].w != 1) {
            if (0 < (int)local_60) {
              local_b0 = (float *)0x0;
              do {
                local_98._0_8_ = local_70->data;
                pfVar42 = (float *)((long)local_70[1].data + (long)local_b0 * 0x10);
                _local_48 = *(undefined8 *)pfVar42;
                _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                if (0 < (int)local_68) {
                  lVar44 = local_b8->cstep * local_b8->elemsize * (long)local_b0;
                  pvVar10 = local_b8->data;
                  local_98._0_8_ =
                       (void *)((long)local_70->data +
                               local_70->cstep * local_70->elemsize * (long)local_b0);
                  lVar45 = 0;
                  iVar34 = (int)local_68;
                  do {
                    _local_58 = *(undefined8 *)(local_98._0_8_ + lVar45);
                    _fStack_50 = *(undefined8 *)((float *)(local_98._0_8_ + lVar45) + 2);
                    afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                    auVar14._8_4_ = extraout_XMM0_Dc_15;
                    auVar14._0_8_ = afVar108._0_8_;
                    auVar14._12_4_ = extraout_XMM0_Dd_15;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar45 + lVar44) = auVar14;
                    lVar45 = lVar45 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_b0 = (float *)((long)local_b0 + 1);
              } while (local_b0 != (float *)local_60);
              return 0;
            }
            return 0;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          goto LAB_003a7d15;
        }
        if (local_70[1].dims == 2) {
          if (0 < (int)local_60) {
            local_a8 = 0;
            do {
              if (0 < (int)local_a0) {
                pauVar54 = (undefined1 (*) [16])
                           (local_b8->cstep * local_a8 * local_b8->elemsize + (long)local_b8->data);
                pfVar42 = (float *)((long)local_70[1].w * local_a8 * local_70[1].elemsize +
                                   (long)local_70[1].data);
                pfVar56 = (float *)(local_70->cstep * local_a8 * local_70->elemsize +
                                   (long)local_70->data);
                local_b0._0_4_ = 0;
                do {
                  local_98._0_8_ = pfVar42;
                  _local_48 = *(undefined8 *)pfVar42;
                  _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                  uVar37 = (ulong)local_88 & 0xffffffff;
                  if (0 < (int)local_88) {
                    do {
                      _local_58 = *(undefined8 *)pfVar56;
                      _fStack_50 = *(undefined8 *)(pfVar56 + 2);
                      afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                      auVar13._8_4_ = extraout_XMM0_Dc_05;
                      auVar13._0_8_ = afVar108._0_8_;
                      auVar13._12_4_ = extraout_XMM0_Dd_05;
                      *pauVar54 = auVar13;
                      pfVar56 = pfVar56 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar41 = (int)uVar37 - 1;
                      uVar37 = (ulong)uVar41;
                    } while (uVar41 != 0);
                  }
                  pfVar42 = (float *)(local_98._0_8_ + 0x10);
                  local_b0._0_4_ = (uint)local_b0 + 1;
                } while ((uint)local_b0 != (int)local_a0);
              }
              local_a8 = local_a8 + 1;
            } while (local_a8 != local_60);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        local_a8 = CONCAT44(local_a8._4_4_,iVar39);
        pOVar38 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003a4158;
        local_78 = b;
        local_70 = a;
        local_60 = uVar37;
        Mat::create(this_00,uVar41,uVar50,iVar39,uVar49,local_38,iVar34,(Allocator *)pOVar38);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_70[1].dims;
        if (iVar34 == 1) {
          if (iVar35 != 1 || local_70[1].w != 1) {
            if (0 < (int)local_60) {
              local_b0 = (float *)0x0;
              do {
                local_98._0_8_ = local_70->data;
                pfVar42 = (float *)((long)local_70[1].data + (long)local_b0 * 0x10);
                _local_48 = *(undefined8 *)pfVar42;
                _fStack_40 = *(undefined8 *)(pfVar42 + 2);
                if (0 < (int)local_68) {
                  local_98._0_8_ =
                       (void *)((long)local_70->data +
                               local_70->cstep * local_70->elemsize * (long)local_b0);
                  lVar45 = local_b8->cstep * local_b8->elemsize * (long)local_b0;
                  pvVar10 = local_b8->data;
                  lVar44 = 0;
                  iVar34 = (int)local_68;
                  do {
                    _local_58 = *(undefined8 *)(local_98._0_8_ + lVar44);
                    _fStack_50 = *(undefined8 *)((float *)(local_98._0_8_ + lVar44) + 2);
                    afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                    auVar79._8_4_ = extraout_XMM0_Dc_14;
                    auVar79._0_8_ = afVar108._0_8_;
                    auVar79._12_4_ = extraout_XMM0_Dd_14;
                    *(undefined1 (*) [16])((long)pvVar10 + lVar44 + lVar45) = auVar79;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_b0 = (float *)((long)local_b0 + 1);
              } while (local_b0 != (float *)local_60);
              return 0;
            }
            return 0;
          }
          pOVar38 = (Option *)opt->blob_allocator;
          b = local_78;
          goto LAB_003a7d15;
        }
        if (iVar34 == 3) {
          if (0 < (int)local_60) {
            local_68 = 0;
            do {
              if (0 < (int)local_a8) {
                pauVar54 = (undefined1 (*) [16])
                           (local_b8->cstep * local_68 * local_b8->elemsize + (long)local_b8->data);
                pfVar56 = (float *)(local_70[1].cstep * local_68 * local_70[1].elemsize +
                                   (long)local_70[1].data);
                pfVar57 = (float *)(local_70->cstep * local_68 * local_70->elemsize +
                                   (long)local_70->data);
                iVar34 = 0;
                pfVar42 = local_a0;
                do {
                  local_78 = (Mat *)CONCAT44(local_78._4_4_,iVar34);
                  if (0 < (int)pfVar42) {
                    local_b0._0_4_ = 0;
                    do {
                      local_98._0_8_ = pfVar56;
                      _local_48 = *(undefined8 *)pfVar56;
                      _fStack_40 = *(undefined8 *)(pfVar56 + 2);
                      uVar37 = (ulong)local_88 & 0xffffffff;
                      if (0 < (int)local_88) {
                        do {
                          _local_58 = *(undefined8 *)pfVar57;
                          _fStack_50 = *(undefined8 *)(pfVar57 + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                          auVar68._8_4_ = extraout_XMM0_Dc_11;
                          auVar68._0_8_ = afVar108._0_8_;
                          auVar68._12_4_ = extraout_XMM0_Dd_11;
                          *pauVar54 = auVar68;
                          pfVar57 = pfVar57 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = (int)uVar37 - 1;
                          uVar37 = (ulong)uVar41;
                        } while (uVar41 != 0);
                      }
                      pfVar56 = (float *)(local_98._0_8_ + 0x10);
                      local_b0._0_4_ = (uint)local_b0 + 1;
                      pfVar42 = local_a0;
                    } while ((uint)local_b0 != (int)local_a0);
                  }
                  iVar34 = (int)local_78 + 1;
                } while (iVar34 != (int)local_a8);
              }
              local_68 = local_68 + 1;
            } while (local_68 != local_60);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 2) {
          if (0 < (int)local_60) {
            local_68 = 0;
            do {
              if (0 < (int)local_a8) {
                pauVar54 = (undefined1 (*) [16])
                           (local_b8->cstep * local_68 * local_b8->elemsize + (long)local_b8->data);
                local_b0 = (float *)((long)local_70[1].w * local_68 * local_70[1].elemsize +
                                    (long)local_70[1].data);
                pfVar56 = (float *)(local_70->cstep * local_68 * local_70->elemsize +
                                   (long)local_70->data);
                iVar34 = 0;
                pfVar42 = local_a0;
                do {
                  local_78 = (Mat *)CONCAT44(local_78._4_4_,iVar34);
                  _local_48 = *(undefined8 *)local_b0;
                  _fStack_40 = *(undefined8 *)(local_b0 + 2);
                  if (0 < (int)pfVar42) {
                    iVar34 = 0;
                    do {
                      local_98._0_4_ = iVar34;
                      uVar37 = (ulong)local_88 & 0xffffffff;
                      if (0 < (int)local_88) {
                        do {
                          _local_58 = *(undefined8 *)pfVar56;
                          _fStack_50 = *(undefined8 *)(pfVar56 + 2);
                          afVar108 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_b9,(__m128 *)&local_58,(__m128 *)&local_48);
                          auVar11._8_4_ = extraout_XMM0_Dc_02;
                          auVar11._0_8_ = afVar108._0_8_;
                          auVar11._12_4_ = extraout_XMM0_Dd_02;
                          *pauVar54 = auVar11;
                          pfVar56 = pfVar56 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar41 = (int)uVar37 - 1;
                          uVar37 = (ulong)uVar41;
                        } while (uVar41 != 0);
                      }
                      iVar34 = local_98._0_4_ + 1;
                      pfVar42 = local_a0;
                    } while (iVar34 != (int)local_a0);
                  }
                  local_b0 = local_b0 + 4;
                  iVar34 = (int)local_78 + 1;
                } while (iVar34 != (int)local_a8);
              }
              local_68 = local_68 + 1;
            } while (local_68 != local_60);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 7:
    pMVar46 = a;
    a = b;
LAB_003a3441:
    iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_sub>(a,pMVar46,this_00,opt);
    return iVar34;
  case 8:
    pMVar46 = a;
    a = b;
LAB_003a37c1:
    iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_div>(a,pMVar46,this_00,opt);
    return iVar34;
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}